

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

MPP_RET add_new_slot(FileReaderImpl *impl,FileBufSlot *slot)

{
  FileBufSlot **ppFVar1;
  FileBufSlot *slot_local;
  FileReaderImpl *impl_local;
  
  if ((impl == (FileReaderImpl *)0x0) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl","add_new_slot",0x56),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  slot->index = impl->slot_cnt;
  impl->slots[impl->slot_cnt] = slot;
  impl->slot_cnt = impl->slot_cnt + 1;
  if (impl->slot_max <= impl->slot_cnt) {
    ppFVar1 = (FileBufSlot **)
              mpp_osal_realloc("add_new_slot",impl->slots,(ulong)(impl->slot_max << 1) << 3);
    impl->slots = ppFVar1;
    if (impl->slots == (FileBufSlot **)0x0) {
      return MPP_NOK;
    }
    impl->slot_max = impl->slot_max << 1;
  }
  if ((impl->slots == (FileBufSlot **)0x0) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,"impl->slots","add_new_slot",
                 100), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((impl->slot_max <= impl->slot_cnt) &&
     (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                 "impl->slot_cnt < impl->slot_max","add_new_slot",0x65),
     (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  return MPP_OK;
}

Assistant:

static MPP_RET add_new_slot(FileReaderImpl* impl, FileBufSlot *slot)
{
    mpp_assert(impl);

    slot->index = impl->slot_cnt;
    impl->slots[impl->slot_cnt] = slot;
    impl->slot_cnt++;

    if (impl->slot_cnt >= impl->slot_max) {
        impl->slots = mpp_realloc(impl->slots, FileBufSlot*, impl->slot_max * 2);
        if (!impl->slots)
            return MPP_NOK;

        impl->slot_max *= 2;
    }

    mpp_assert(impl->slots);
    mpp_assert(impl->slot_cnt < impl->slot_max);

    return MPP_OK;
}